

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::expression
          (Compiler *this,Ptr *node,ReturnType t,uint16_t write_index,uint16_t *extent_index,
          bool write)

{
  ushort uVar1;
  element_type *peVar2;
  ImageObject *pIVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  Atom *pAVar7;
  uint16_t write_index_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string label;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Class p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->type != Structure) {
    return false;
  }
  label._M_dataplus._M_p = (pointer)&label.field_2;
  label._M_string_length = 0;
  label.field_2._M_local_buf[0] = '\0';
  bVar4 = std::operator!=(&peVar2->label,"");
  if (bVar4) {
    std::__cxx11::string::substr
              ((ulong)&p,
               (ulong)&((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->label);
    std::__cxx11::string::operator=((string *)&label,(string *)&p);
    std::__cxx11::string::~string((string *)&p);
  }
  Class::Class(&p,ANY);
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_108,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  bVar5 = expression_head(this,(Ptr *)&local_108,&p,t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  if (bVar5) {
    if (!bVar4) {
      if (write) {
LAB_00133d1e:
        r_code::Atom::IPointer((ushort)&local_178);
        pAVar7 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
        r_code::Atom::operator=(pAVar7,(Atom *)&local_178);
LAB_00133d4f:
        r_code::Atom::~Atom((Atom *)&local_178);
        pIVar3 = this->current_object;
        uVar1 = *extent_index;
        *extent_index = uVar1 + 1;
        pAVar7 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
        r_code::Atom::operator=(pAVar7,&p.atom);
        write_index_00 = (uint16_t)(byte)*extent_index;
        bVar6 = r_code::Atom::getAtomCount();
        *extent_index = *extent_index + (ushort)bVar6;
      }
      else {
LAB_00133d9e:
        write_index_00 = 0;
      }
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_138,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      bVar4 = expression_tail(this,(Ptr *)&local_138,&p,write_index_00,extent_index,write);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
      goto LAB_00133edf;
    }
    if (this->in_hlp == false) {
      std::__cxx11::string::string((string *)&local_70,(string *)&label);
      bVar4 = addLocalReference(this,&local_70,write_index,&p);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar4) goto LAB_00133c7f;
      std::__cxx11::string::find((char *)&label,0x14675f);
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&label);
      std::operator+(&local_f8,"cast to ",&local_90);
      std::operator+(&local_178,&local_f8,": unknown class");
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_118,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      set_error(this,&local_178,(Ptr *)&local_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_f8);
      this_00 = &local_90;
    }
    else {
LAB_00133c7f:
      if (!write) goto LAB_00133d9e;
      if (this->in_hlp != true) goto LAB_00133d1e;
      std::__cxx11::string::string((string *)&local_50,(string *)&label);
      bVar6 = get_hlp_reference(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar6 != 0xff) {
        r_code::Atom::AssignmentPointer((uchar)&local_178,(ushort)bVar6);
        pAVar7 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
        r_code::Atom::operator=(pAVar7,(Atom *)&local_178);
        goto LAB_00133d4f;
      }
      std::__cxx11::string::string
                ((string *)&local_178," error: undeclared variable",(allocator *)&local_f8);
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_128,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      set_error(this,&local_178,(Ptr *)&local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
      this_00 = &local_178;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  bVar4 = false;
LAB_00133edf:
  Class::~Class(&p);
  std::__cxx11::string::~string((string *)&label);
  return bVar4;
}

Assistant:

bool Compiler::expression(RepliStruct::Ptr node, const ReturnType t, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->type != RepliStruct::Structure) {
        return false;
    }

    bool lbl = false;
    std::string label;

    if (node->label != "") {
        label = node->label.substr(0, node->label.size() - 1);
        lbl = true;
    }

    Class p;

    if (!expression_head(node, p, t)) {
        return false;
    }

    if (lbl && !in_hlp) {
        if (!addLocalReference(label, write_index, p)) {
            set_error("cast to " + label.substr(label.find("#") + 1) + ": unknown class", node);
            return false;
        }
    }

    uint8_t tail_write_index = 0;

    if (write) {
        if (lbl && in_hlp) {
            uint8_t variable_index = get_hlp_reference(label);

            if (variable_index == 0xFF) {
                set_error(" error: undeclared variable", node);
                return false;
            }

            current_object->code[write_index] = Atom::AssignmentPointer(variable_index, extent_index);
        } else {
            current_object->code[write_index] = Atom::IPointer(extent_index);
        }

        current_object->code[extent_index++] = p.atom;
        tail_write_index = extent_index;
        extent_index += p.atom.getAtomCount();
    }

    if (!expression_tail(node, p, tail_write_index, extent_index, write)) {
        return false;
    }

    return true;
}